

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

int google::protobuf::compiler::ruby::GeneratePackageModules(FileDescriptor *file,Printer *printer)

{
  undefined4 uVar1;
  bool bVar2;
  byte bVar3;
  FileOptions *pFVar4;
  long lVar5;
  LogMessage *pLVar6;
  string *psVar7;
  char *pcVar8;
  string local_140;
  string local_120 [32];
  string local_100 [32];
  undefined1 local_e0 [8];
  string component;
  size_t dot_index;
  int delimiter_size;
  string delimiter;
  LogMessage local_88;
  string local_40 [8];
  string package_name;
  bool need_change_to_module;
  int levels;
  Printer *printer_local;
  FileDescriptor *file_local;
  
  package_name.field_2._12_4_ = 0;
  package_name.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::string(local_40);
  pFVar4 = FileDescriptor::options(file);
  bVar2 = FileOptions::has_ruby_package(pFVar4);
  if (bVar2) {
    pFVar4 = FileDescriptor::options(file);
    psVar7 = FileOptions::ruby_package_abi_cxx11_(pFVar4);
    std::__cxx11::string::operator=(local_40,(string *)psVar7);
    lVar5 = std::__cxx11::string::find((char *)local_40,0x7a28e5);
    if (lVar5 == -1) {
      internal::LogMessage::LogMessage
                (&local_88,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                 ,0x1a9);
      pLVar6 = internal::LogMessage::operator<<
                         (&local_88,"ruby_package option should be in the form of:");
      pLVar6 = internal::LogMessage::operator<<(pLVar6," \'A::B::C\' and not \'A.B.C\'");
      internal::LogFinisher::operator=((LogFinisher *)(delimiter.field_2._M_local_buf + 0xf),pLVar6)
      ;
      internal::LogMessage::~LogMessage(&local_88);
    }
    else {
      package_name.field_2._M_local_buf[0xb] = '\0';
    }
  }
  else {
    psVar7 = FileDescriptor::package_abi_cxx11_(file);
    std::__cxx11::string::operator=(local_40,(string *)psVar7);
  }
  pcVar8 = "::";
  if ((package_name.field_2._M_local_buf[0xb] & 1U) != 0) {
    pcVar8 = ".";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&delimiter_size,pcVar8,(allocator *)((long)&dot_index + 7))
  ;
  std::allocator<char>::~allocator((allocator<char> *)((long)&dot_index + 7));
  dot_index._0_4_ = 2;
  if ((package_name.field_2._M_local_buf[0xb] & 1U) != 0) {
    dot_index._0_4_ = 1;
  }
  while (bVar3 = std::__cxx11::string::empty(), uVar1 = package_name.field_2._12_4_,
        ((bVar3 ^ 0xff) & 1) != 0) {
    component.field_2._8_8_ = std::__cxx11::string::find(local_40,(ulong)&delimiter_size);
    std::__cxx11::string::string((string *)local_e0);
    if (component.field_2._8_8_ == -1) {
      std::__cxx11::string::operator=((string *)local_e0,local_40);
      std::__cxx11::string::operator=(local_40,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_100,(ulong)local_40);
      std::__cxx11::string::operator=((string *)local_e0,local_100);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::substr((ulong)local_120,(ulong)local_40);
      std::__cxx11::string::operator=(local_40,local_120);
      std::__cxx11::string::~string(local_120);
    }
    if ((package_name.field_2._M_local_buf[0xb] & 1U) != 0) {
      PackageToModule(&local_140,(string *)local_e0);
      std::__cxx11::string::operator=((string *)local_e0,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"module $name$\n",(char (*) [5])0x77db8d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    io::Printer::Indent(printer);
    package_name.field_2._12_4_ = package_name.field_2._12_4_ + 1;
    std::__cxx11::string::~string((string *)local_e0);
  }
  std::__cxx11::string::~string((string *)&delimiter_size);
  std::__cxx11::string::~string(local_40);
  return uVar1;
}

Assistant:

int GeneratePackageModules(const FileDescriptor* file, io::Printer* printer) {
  int levels = 0;
  bool need_change_to_module = true;
  std::string package_name;

  // Determine the name to use in either format:
  //   proto package:         one.two.three
  //   option ruby_package:   One::Two::Three
  if (file->options().has_ruby_package()) {
    package_name = file->options().ruby_package();

    // If :: is in the package use the Ruby formatted name as-is
    //    -> A::B::C
    // otherwise, use the dot separator
    //    -> A.B.C
    if (package_name.find("::") != std::string::npos) {
      need_change_to_module = false;
    } else {
      GOOGLE_LOG(WARNING) << "ruby_package option should be in the form of:"
                          << " 'A::B::C' and not 'A.B.C'";
    }
  } else {
    package_name = file->package();
  }

  // Use the appropriate delimiter
  std::string delimiter = need_change_to_module ? "." : "::";
  int delimiter_size = need_change_to_module ? 1 : 2;

  // Extract each module name and indent
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(delimiter);
    std::string component;
    if (dot_index == std::string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + delimiter_size);
    }
    if (need_change_to_module) {
      component = PackageToModule(component);
    }
    printer->Print(
      "module $name$\n",
      "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}